

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O3

void __thiscall
anon_unknown.dwarf_5ac4a9::UsageRequirementProperty::WriteDirect
          (UsageRequirementProperty *this,
          BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *value,Action action)

{
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  
  this_00 = &this->Entries;
  if (action == Prepend) {
    std::
    vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::_M_insert_rval(this_00,(this_00->
                             super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start,value);
    return;
  }
  std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
  emplace_back<BT<std::__cxx11::string>>
            ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)this_00,
             value);
  return;
}

Assistant:

void UsageRequirementProperty::WriteDirect(BT<std::string> value,
                                           Action action)
{
  if (action == Action::Set) {
    this->Entries.clear();
  }
  if (action == Action::Prepend) {
    this->Entries.emplace(this->Entries.begin(), std::move(value));
  } else {
    this->Entries.emplace_back(std::move(value));
  }
}